

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::SegmentInfo::Init(SegmentInfo *this)

{
  size_t __n;
  void *pvVar1;
  long in_RDI;
  size_t app_len;
  char temp [256];
  int32_t revision;
  int32_t build;
  int32_t minor;
  int32_t major;
  char *in_stack_fffffffffffffed8;
  SegmentInfo *in_stack_fffffffffffffee0;
  int32 local_20;
  uint local_1c;
  uint local_18;
  uint local_14 [4];
  bool local_1;
  
  GetVersion((int32 *)local_14,(int32 *)&local_18,(int32 *)&local_1c,&local_20);
  snprintf(&stack0xfffffffffffffed8,0x100,"libwebm-%d.%d.%d.%d",(ulong)local_14[0],(ulong)local_18,
           (ulong)local_1c,local_20);
  __n = strlen(&stack0xfffffffffffffed8);
  if (*(void **)(in_RDI + 8) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 8));
  }
  pvVar1 = operator_new__(__n + 1,(nothrow_t *)&std::nothrow);
  *(void **)(in_RDI + 8) = pvVar1;
  if (*(long *)(in_RDI + 8) == 0) {
    local_1 = false;
  }
  else {
    memcpy(*(void **)(in_RDI + 8),&stack0xfffffffffffffed8,__n);
    *(undefined1 *)(*(long *)(in_RDI + 8) + __n) = 0;
    set_writing_app(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if (*(long *)(in_RDI + 0x18) == 0) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool SegmentInfo::Init() {
  int32_t major;
  int32_t minor;
  int32_t build;
  int32_t revision;
  GetVersion(&major, &minor, &build, &revision);
  char temp[256];
#ifdef _MSC_VER
  sprintf_s(temp, sizeof(temp) / sizeof(temp[0]), "libwebm-%d.%d.%d.%d", major,
            minor, build, revision);
#else
  snprintf(temp, sizeof(temp) / sizeof(temp[0]), "libwebm-%d.%d.%d.%d", major,
           minor, build, revision);
#endif

  const size_t app_len = strlen(temp) + 1;

  delete[] muxing_app_;

  muxing_app_ = new (std::nothrow) char[app_len];  // NOLINT
  if (!muxing_app_)
    return false;

  memcpy(muxing_app_, temp, app_len - 1);
  muxing_app_[app_len - 1] = '\0';

  set_writing_app(temp);
  if (!writing_app_)
    return false;
  return true;
}